

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_s2c_opening_serialize
              (secp256k1_context *ctx,uchar *output33,secp256k1_ecdsa_s2c_opening *opening)

{
  size_t local_30;
  size_t out_len;
  secp256k1_ecdsa_s2c_opening *opening_local;
  uchar *output33_local;
  secp256k1_context *ctx_local;
  
  local_30 = 0x21;
  out_len = (size_t)opening;
  opening_local = (secp256k1_ecdsa_s2c_opening *)output33;
  output33_local = (uchar *)ctx;
  if (output33 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output33 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (opening == (secp256k1_ecdsa_s2c_opening *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"opening != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ =
         secp256k1_ec_pubkey_serialize(ctx,output33,&local_30,(secp256k1_pubkey *)opening,0x102);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_s2c_opening_serialize(const secp256k1_context* ctx, unsigned char* output33, const secp256k1_ecdsa_s2c_opening* opening) {
    size_t out_len = 33;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output33 != NULL);
    ARG_CHECK(opening != NULL);
    return secp256k1_ec_pubkey_serialize(ctx, output33, &out_len, (const secp256k1_pubkey*) opening, SECP256K1_EC_COMPRESSED);
}